

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  trico_stream_type tVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  FILE *__stream;
  uint8_t *data;
  size_t sVar11;
  void *a;
  char cVar12;
  ulong uVar13;
  char *pcVar14;
  char *__format;
  float fVar15;
  uint32_t nr_of_vertices;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float *triangle_normals;
  uint32_t *tria_indices;
  float *texcoords;
  uint32_t *vertex_colors;
  float *vertex_normals;
  uint16_t *attributes;
  float local_4e8;
  float local_4e4;
  char *local_4e0;
  uint local_4d4;
  ulong local_4d0;
  float *vertices;
  ulong local_498;
  char new_filename [1024];
  
  if (argc < 3) {
    puts("Usage: trico_decoder -i <input> [options]\n");
    puts("Options:");
    puts("  -i <input>           input file name.");
    puts("  -o <output>          output file name of type stl or ply.");
    putchar(10);
    return -1;
  }
  local_4e4 = (float)(argc + -1);
  fVar15 = 1.4013e-45;
  local_4e0 = (char *)0x0;
  bVar3 = true;
  local_4e8 = 0.0;
  do {
    pcVar14 = argv[(int)fVar15];
    iVar6 = strcmp(pcVar14,"-i");
    if (iVar6 == 0) {
      if (fVar15 == local_4e4) {
        pcVar14 = "I expect a filename after command -i";
LAB_00104807:
        puts(pcVar14);
        goto LAB_0010480c;
      }
      local_4e0 = argv[(long)(int)fVar15 + 1];
    }
    else {
      iVar6 = strcmp(pcVar14,"-o");
      if (iVar6 != 0) {
        printf("Unknown command %s\n",pcVar14);
LAB_0010480c:
        iVar6 = -1;
        goto LAB_00104811;
      }
      if (fVar15 == local_4e4) {
        pcVar14 = "I expect a filename after command -o";
        goto LAB_00104807;
      }
      pcVar14 = argv[(long)(int)fVar15 + 1];
      cVar12 = *pcVar14;
      if (cVar12 == '\0') {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        do {
          new_filename[uVar13] = cVar12;
          cVar12 = pcVar14[uVar13 + 1];
          uVar13 = uVar13 + 1;
        } while (cVar12 != '\0');
        uVar13 = uVar13 & 0xffffffff;
      }
      new_filename[uVar13] = '\0';
      local_4e8 = 1.4013e-45;
    }
    fVar15 = (float)((int)fVar15 + 2);
    bVar3 = (int)fVar15 < argc;
  } while ((int)fVar15 < argc);
  iVar6 = 0;
LAB_00104811:
  pcVar14 = local_4e0;
  if (bVar3) {
    return iVar6;
  }
  if (local_4e0 != (char *)0x0) {
    iVar6 = stat(local_4e0,(stat *)&vertices);
    uVar13 = -(ulong)(iVar6 != 0) | local_498;
    if ((long)uVar13 < 0) {
      __format = "There was an error reading file %s\n";
    }
    else {
      __stream = fopen(pcVar14,"rb");
      if (__stream == (FILE *)0x0) {
        __format = "Cannot open file: %s\n";
      }
      else {
        data = (uint8_t *)malloc(uVar13);
        sVar11 = fread(data,1,uVar13,__stream);
        if (sVar11 != uVar13) {
          printf("There was an error reading file %s\n",local_4e0);
          fclose(__stream);
          return -1;
        }
        fclose(__stream);
        a = trico_open_archive_for_reading(data,uVar13);
        if (a != (void *)0x0) {
          uVar13 = 0;
          vertices = (float *)0x0;
          tria_indices = (uint32_t *)0x0;
          triangle_normals = (float *)0x0;
          vertex_normals = (float *)0x0;
          vertex_colors = (uint32_t *)0x0;
          texcoords = (float *)0x0;
          attributes = (uint16_t *)0x0;
          nr_of_vertices = 0;
LAB_001048fd:
          tVar7 = trico_get_next_stream_type(a);
          switch(tVar7) {
          case trico_empty:
            trico_close_archive(a);
            free(data);
            fVar15 = local_4e8;
            if (local_4e8 == 0.0) {
              uVar10 = 0;
              uVar9 = 0;
            }
            else {
              uVar9 = extension_is_stl(new_filename);
              uVar10 = extension_is_ply(new_filename);
            }
            if (uVar9 == 0 && uVar10 == 0) {
              uVar9 = (uint)((texcoords == (float *)0x0 && vertex_colors == (uint32_t *)0x0) &&
                            vertex_normals == (float *)0x0);
              uVar10 = (uint)((texcoords != (float *)0x0 || vertex_colors != (uint32_t *)0x0) ||
                             vertex_normals != (float *)0x0);
            }
            if (fVar15 == 0.0) {
              if (uVar10 == 0) {
                change_extension_to_stl(new_filename,local_4e0);
              }
              else {
                change_extension_to_ply(new_filename,local_4e0);
              }
            }
            local_4d4 = uVar9;
            if (((uVar9 != 0) && (triangle_normals == (float *)0x0)) &&
               (triangle_normals = (float *)malloc((ulong)(uint)((int)uVar13 * 3) << 2),
               (int)uVar13 != 0)) {
              uVar5 = uVar13 * 3;
              uVar16 = 0;
              local_4d0 = uVar13;
              do {
                uVar8 = tria_indices[uVar16 & 0xffffffff];
                uVar9 = (int)uVar16 + 1;
                uVar1 = tria_indices[uVar9];
                uVar10 = (int)uVar16 + 2;
                uVar2 = tria_indices[uVar10];
                fVar17 = vertices[uVar1 * 3] - vertices[uVar8 * 3];
                fVar19 = vertices[uVar1 * 3 + 1] - vertices[uVar8 * 3 + 1];
                fVar22 = vertices[uVar1 * 3 + 2] - vertices[uVar8 * 3 + 2];
                fVar18 = vertices[uVar2 * 3] - vertices[uVar8 * 3];
                fVar21 = vertices[uVar2 * 3 + 1] - vertices[uVar8 * 3 + 1];
                fVar20 = vertices[uVar2 * 3 + 2] - vertices[uVar8 * 3 + 2];
                fVar15 = fVar19 * fVar20 - fVar21 * fVar22;
                fVar20 = fVar22 * fVar18 - fVar20 * fVar17;
                fVar17 = fVar21 * fVar17 - fVar18 * fVar19;
                fVar18 = fVar17 * fVar17 + fVar15 * fVar15 + fVar20 * fVar20;
                if (fVar18 < 0.0) {
                  local_4e0 = (char *)CONCAT44(local_4e0._4_4_,fVar15);
                  local_4e8 = fVar20;
                  local_4e4 = fVar17;
                  fVar18 = sqrtf(fVar18);
                  uVar13 = local_4d0;
                  fVar15 = local_4e0._0_4_;
                  fVar17 = local_4e4;
                  fVar20 = local_4e8;
                }
                else {
                  fVar18 = SQRT(fVar18);
                }
                bVar3 = NAN(fVar18);
                bVar4 = fVar18 == 0.0;
                fVar19 = fVar15 / fVar18;
                if ((bVar4) && (!bVar3)) {
                  fVar19 = fVar15;
                }
                triangle_normals[uVar16 & 0xffffffff] = fVar19;
                fVar15 = fVar20 / fVar18;
                if ((bVar4) && (!bVar3)) {
                  fVar15 = fVar20;
                }
                triangle_normals[uVar9] = fVar15;
                fVar15 = fVar17 / fVar18;
                if ((bVar4) && (!bVar3)) {
                  fVar15 = fVar17;
                }
                triangle_normals[uVar10] = fVar15;
                uVar16 = uVar16 + 3;
              } while (uVar5 != uVar16);
            }
            if (local_4d4 == 0) {
              iVar6 = trico_write_ply(nr_of_vertices,vertices,vertex_normals,vertex_colors,
                                      (uint32_t)uVar13,tria_indices,texcoords,new_filename);
            }
            else {
              iVar6 = trico_write_stl(vertices,tria_indices,(uint32_t)uVar13,triangle_normals,
                                      attributes,new_filename);
            }
            if (iVar6 != 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              return 0;
            }
            __format = "Could not write to %s\n";
            pcVar14 = new_filename;
            goto LAB_00104afb;
          case trico_vertex_float_stream:
            nr_of_vertices = trico_get_number_of_vertices(a);
            vertices = (float *)malloc((ulong)(nr_of_vertices * 3) << 2);
            iVar6 = trico_read_vertices(a,&vertices);
            if (iVar6 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(data);
              pcVar14 = "Something went wrong when reading the vertices";
              goto LAB_00104ade;
            }
            goto LAB_001048fd;
          default:
            trico_skip_next_stream(a);
            goto LAB_001048fd;
          case trico_triangle_uint32_stream:
            uVar8 = trico_get_number_of_triangles(a);
            uVar13 = (ulong)uVar8;
            tria_indices = (uint32_t *)malloc((ulong)(uVar8 * 3) << 2);
            iVar6 = trico_read_triangles(a,&tria_indices);
            if (iVar6 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(data);
              pcVar14 = "Something went wrong when reading the triangles";
              goto LAB_00104ade;
            }
            goto LAB_001048fd;
          case trico_uv_per_triangle_float_stream:
            uVar8 = trico_get_number_of_uvs(a);
            texcoords = (float *)malloc((ulong)(uVar8 * 2) << 2);
            iVar6 = trico_read_uv_per_triangle(a,&texcoords);
            if (iVar6 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(data);
              pcVar14 = "Something went wrong when reading the texture coordinates";
              goto LAB_00104ade;
            }
            goto LAB_001048fd;
          case trico_vertex_normal_float_stream:
            uVar8 = trico_get_number_of_normals(a);
            vertex_normals = (float *)malloc((ulong)(uVar8 * 3) << 2);
            iVar6 = trico_read_vertex_normals(a,&vertex_normals);
            if (iVar6 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(data);
              pcVar14 = "Something went wrong when reading the vertex normals";
              goto LAB_00104ade;
            }
            goto LAB_001048fd;
          case trico_triangle_normal_float_stream:
            uVar8 = trico_get_number_of_normals(a);
            triangle_normals = (float *)malloc((ulong)(uVar8 * 3) << 2);
            iVar6 = trico_read_triangle_normals(a,&triangle_normals);
            if (iVar6 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(data);
              pcVar14 = "Something went wrong when reading the triangle normals";
              goto LAB_00104ade;
            }
            goto LAB_001048fd;
          case trico_vertex_color_stream:
            uVar8 = trico_get_number_of_colors(a);
            vertex_colors = (uint32_t *)malloc((ulong)uVar8 << 2);
            iVar6 = trico_read_vertex_colors(a,&vertex_colors);
            if (iVar6 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(data);
              pcVar14 = "Something went wrong when reading the vertex colors";
              goto LAB_00104ade;
            }
            goto LAB_001048fd;
          case trico_attribute_uint16_stream:
            goto switchD_00104914_caseD_12;
          }
        }
        __format = "The input file %s is not a trico archive.\n";
        pcVar14 = local_4e0;
      }
    }
LAB_00104afb:
    printf(__format,pcVar14);
    return -1;
  }
  pcVar14 = "An input file name is required";
LAB_00104ade:
  puts(pcVar14);
  return -1;
switchD_00104914_caseD_12:
  uVar8 = trico_get_number_of_attributes(a);
  attributes = (uint16_t *)malloc((ulong)uVar8 * 2);
  iVar6 = trico_read_attributes_uint16(a,&attributes);
  if (iVar6 == 0) goto code_r0x00104a79;
  goto LAB_001048fd;
code_r0x00104a79:
  free(vertices);
  free(triangle_normals);
  free(vertex_normals);
  free(vertex_colors);
  free(texcoords);
  free(tria_indices);
  free(attributes);
  trico_close_archive(a);
  free(data);
  pcVar14 = "Something went wrong when reading the attributes";
  goto LAB_00104ade;
}

Assistant:

int main(int argc, const char** argv)
  {
  if (argc < 3)
    {
    print_help();
    return -1;
    }
  const char* filename = NULL;
  int output_filename = 0;
  char new_filename[1024];
  for (int j = 1; j < argc; ++j)
    {
    if (strcmp(argv[j], "-i") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -i\n");
        return -1;
        }
      ++j;
      filename = argv[j];
      }
    else if (strcmp(argv[j], "-o") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -o\n");
        return -1;
        }
      ++j;
      const char* ptr = argv[j];
      int idx = 0;
      while (*ptr)
        new_filename[idx++] = *ptr++;
      new_filename[idx] = 0;
      output_filename = 1;
      }
    else
      {
      printf("Unknown command %s\n", argv[j]);
      return -1;
      }
    }

  if (!filename)
    {
    printf("An input file name is required\n");
    return -1;
    }


  long long size = fsize(filename);
  if (size < 0)
    {
    printf("There was an error reading file %s\n", filename);
    return -1;
    }

  FILE* f = fopen(filename, "rb");
  if (!f)
    {
    printf("Cannot open file: %s\n", filename);
    return -1;
    }
  char* buffer = (char*)malloc(size);
  long long fl = (long long)fread(buffer, 1, size, f);
  if (fl != size)
    {
    printf("There was an error reading file %s\n", filename);
    fclose(f);
    return -1;
    }
  fclose(f);

  void* arch = trico_open_archive_for_reading((const uint8_t*)buffer, size);
  if (!arch)
    {
    printf("The input file %s is not a trico archive.\n", filename);
    return -1;
    }

  float* vertices = NULL;
  uint32_t* tria_indices = NULL;
  float* triangle_normals = NULL;
  float* vertex_normals = NULL;
  uint32_t* vertex_colors = NULL;
  float* texcoords = NULL;
  uint16_t* attributes = NULL;
  uint32_t nr_of_vertices = 0;
  uint32_t nr_of_triangles = 0;
  uint32_t nr_of_triangle_normals = 0;
  uint32_t nr_of_vertex_normals = 0;
  uint32_t nr_of_vertex_colors = 0;
  uint32_t nr_of_texcoords = 0;
  uint32_t nr_of_attributes = 0;

  enum trico_stream_type st = trico_get_next_stream_type(arch);
  while (!st == trico_empty)
    {
    switch (st)
      {
      case trico_vertex_float_stream:
      {
      nr_of_vertices = trico_get_number_of_vertices(arch);
      vertices = (float*)malloc(nr_of_vertices * 3 * sizeof(float));
      if (!trico_read_vertices(arch, &vertices))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertices\n");
        return -1;
        }
      break;
      }
      case trico_triangle_normal_float_stream:
      {
      nr_of_triangle_normals = trico_get_number_of_normals(arch);
      triangle_normals = (float*)malloc(nr_of_triangle_normals * 3 * sizeof(float));
      if (!trico_read_triangle_normals(arch, &triangle_normals))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the triangle normals\n");
        return -1;
        }
      break;
      }
      case trico_vertex_normal_float_stream:
      {
      nr_of_vertex_normals = trico_get_number_of_normals(arch);
      vertex_normals = (float*)malloc(nr_of_vertex_normals * 3 * sizeof(float));
      if (!trico_read_vertex_normals(arch, &vertex_normals))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertex normals\n");
        return -1;
        }
      break;
      }
      case trico_vertex_color_stream:
      {
      nr_of_vertex_colors = trico_get_number_of_colors(arch);
      vertex_colors = (uint32_t*)malloc(nr_of_vertex_colors * sizeof(uint32_t));
      if (!trico_read_vertex_colors(arch, &vertex_colors))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertex colors\n");
        return -1;
        }
      break;
      }
      case trico_triangle_uint32_stream:
      {
      nr_of_triangles = trico_get_number_of_triangles(arch);
      tria_indices = (uint32_t*)malloc(nr_of_triangles * 3 * sizeof(uint32_t));
      if (!trico_read_triangles(arch, &tria_indices))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the triangles\n");
        return -1;
        }
      break;
      }
      case trico_attribute_uint16_stream:
      {
      nr_of_attributes = trico_get_number_of_attributes(arch);
      attributes = (uint16_t*)malloc(nr_of_attributes * sizeof(uint16_t));
      if (!trico_read_attributes_uint16(arch, &attributes))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the attributes\n");
        return -1;
        }
      break;
      }
      case trico_uv_per_triangle_float_stream:
      {
      nr_of_texcoords = trico_get_number_of_uvs(arch);
      texcoords = (float*)malloc(nr_of_texcoords * 2 * sizeof(float));
      if (!trico_read_uv_per_triangle(arch, &texcoords))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the texture coordinates\n");
        return -1;
        }
      break;
      }
      default:
      {
      trico_skip_next_stream(arch);
      break;
      }
      }

    st = trico_get_next_stream_type(arch);
    }

  trico_close_archive(arch);
  free(buffer);

  int output_as_stl = 0;
  int output_as_ply = 0;

  if (output_filename)
    {
    output_as_stl = extension_is_stl(new_filename);
    output_as_ply = extension_is_ply(new_filename);
    }

  if (!output_as_stl && !output_as_ply)
    {
    if (vertex_colors || texcoords || vertex_normals)
      output_as_ply = 1;
    else
      output_as_stl = 1;
    }

  if (!output_filename)
    {
    if (output_as_ply)
      change_extension_to_ply(new_filename, filename);
    else
      change_extension_to_stl(new_filename, filename);
    }

  if (output_as_stl && (triangle_normals == NULL))
    {
    triangle_normals = (float*)malloc(nr_of_triangles * 3 * sizeof(float));
    for (uint32_t t = 0; t < nr_of_triangles; ++t)
      {
      const uint32_t v0 = tria_indices[t * 3];
      const uint32_t v1 = tria_indices[t * 3 + 1];
      const uint32_t v2 = tria_indices[t * 3 + 2];
      const float x0 = vertices[v0 * 3];
      const float y0 = vertices[v0 * 3 + 1];
      const float z0 = vertices[v0 * 3 + 2];
      const float x1 = vertices[v1 * 3];
      const float y1 = vertices[v1 * 3 + 1];
      const float z1 = vertices[v1 * 3 + 2];
      const float x2 = vertices[v2 * 3];
      const float y2 = vertices[v2 * 3 + 1];
      const float z2 = vertices[v2 * 3 + 2];
      const float ax = x1 - x0;
      const float ay = y1 - y0;
      const float az = z1 - z0;
      const float bx = x2 - x0;
      const float by = y2 - y0;
      const float bz = z2 - z0;
      const float nx = ay * bz - az * by;
      const float ny = az * bx - ax * bz;
      const float nz = ax * by - ay * bx;
      const float length = (float)sqrt((double)(nx*nx + ny * ny + nz * nz));
      triangle_normals[t * 3] = length ? nx / length : nx;
      triangle_normals[t * 3 + 1] = length ? ny / length : ny;
      triangle_normals[t * 3 + 2] = length ? nz / length : nz;
      }
    }

  if (output_as_stl)
    {
    if (!trico_write_stl(vertices, tria_indices, nr_of_triangles, triangle_normals, attributes, new_filename))
      {
      printf("Could not write to %s\n", new_filename);
      return -1;
      }
    }
  else
    {
    if (!trico_write_ply(nr_of_vertices, vertices, vertex_normals, vertex_colors, nr_of_triangles, tria_indices, texcoords, new_filename))
      {
      printf("Could not write to %s\n", new_filename);
      return -1;
      }
    }
  
  free(vertices);
  free(triangle_normals);
  free(vertex_normals);
  free(vertex_colors);
  free(texcoords);
  free(tria_indices);
  free(attributes);
  return 0;
  }